

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void pack_cell(cellp *p,vector<int,_std::allocator<int>_> *particle_numbers,size_t *pn_index,
              vector<particle,_std::allocator<particle>_> *particles,size_t *p_index)

{
  reference pvVar1;
  size_type sVar2;
  reference __dest;
  vector<particle,_std::allocator<particle>_> *in_RCX;
  size_type *in_RDX;
  vector<int,_std::allocator<int>_> *in_RSI;
  undefined8 *in_RDI;
  ulong *in_R8;
  particle *current;
  undefined8 local_30;
  
  local_30 = (void *)*in_RDI;
  pvVar1 = std::vector<int,_std::allocator<int>_>::operator[](in_RSI,*in_RDX);
  *pvVar1 = 0;
  while (local_30 != (void *)0x0) {
    sVar2 = std::vector<particle,_std::allocator<particle>_>::size(in_RCX);
    if (sVar2 <= *in_R8) {
      std::vector<particle,_std::allocator<particle>_>::size(in_RCX);
      std::vector<particle,_std::allocator<particle>_>::resize(in_RCX,(size_type)in_R8);
    }
    sVar2 = *in_R8;
    *in_R8 = sVar2 + 1;
    __dest = std::vector<particle,_std::allocator<particle>_>::operator[](in_RCX,sVar2);
    memcpy(__dest,local_30,0x68);
    local_30 = *(void **)((long)local_30 + 0x58);
    pvVar1 = std::vector<int,_std::allocator<int>_>::operator[](in_RSI,*in_RDX);
    *pvVar1 = *pvVar1 + 1;
  }
  *in_RDX = *in_RDX + 1;
  return;
}

Assistant:

void pack_cell(cellp & p, vector<int> & particle_numbers, size_t & pn_index, vector<particle> & particles, size_t & p_index) {
    particle* current = p.pl.head;
    particle_numbers[pn_index] = 0;
    while (current != 0) {
        if (particles.size() <= p_index) {
            particles.resize(3 * particles.size() / 2 + 1);
        }
        particles[p_index++] = *current;

        current = current->next;
        particle_numbers[pn_index]++;
    }
    pn_index++;
}